

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QByteArray *
anon_unknown.dwarf_1242596::ZoneNameReader::etcContent
          (QByteArray *__return_storage_ptr__,QString *path)

{
  int iVar1;
  int __oflag;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_40;
  QFile local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_28.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_28,path);
  iVar1 = QFile::open(&local_28,(char *)0x1,__oflag);
  if ((char)iVar1 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QIODevice::readAll((QByteArray *)&local_40,(QIODevice *)&local_28);
    QByteArray::trimmed_helper(__return_storage_ptr__,(QByteArray *)&local_40);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  }
  QFile::~QFile(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray etcContent(const QString &path)
    {
        QFile zone(path);
        if (zone.open(QIODevice::ReadOnly))
            return zone.readAll().trimmed();

        return QByteArray();
    }